

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O2

void InitRectifyMap(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  MatCommaInitializer_<double> *pMVar4;
  MatCommaInitializer_ *this;
  ostream *poVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  Size local_500;
  Size local_4f8;
  undefined1 local_4f0 [96];
  long *local_490;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488 [11];
  MatCommaInitializer_<double> commaInitializer;
  Mat local_408 [96];
  Mat local_3a8 [96];
  Mat local_348 [96];
  Mat local_2e8 [96];
  Mat local_288 [96];
  Mat local_228 [96];
  Mat local_1c8 [96];
  Mat local_168 [96];
  Mat local_108 [96];
  Mat local_a8 [96];
  MatCommaInitializer_<double> local_48;
  
  dVar8 = (double)height_now;
  dVar7 = tan((((double)vfov_now * 3.141592653589793) / 180.0) * 0.5);
  cv::Mat_<double>::Mat_((Mat_<double> *)&local_490,3,3);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)&commaInitializer,(Mat *)&local_490);
  dVar7 = (dVar8 * 0.5) / dVar7;
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(&commaInitializer,dVar7);
  local_48.it.super_MatConstIterator_<double>.super_MatConstIterator.m =
       (pMVar4->it).super_MatConstIterator_<double>.super_MatConstIterator.m;
  local_48.it.super_MatConstIterator_<double>.super_MatConstIterator.elemSize =
       (pMVar4->it).super_MatConstIterator_<double>.super_MatConstIterator.elemSize;
  local_48.it.super_MatConstIterator_<double>.super_MatConstIterator.ptr =
       (pMVar4->it).super_MatConstIterator_<double>.super_MatConstIterator.ptr;
  local_48.it.super_MatConstIterator_<double>.super_MatConstIterator.sliceStart =
       (pMVar4->it).super_MatConstIterator_<double>.super_MatConstIterator.sliceStart;
  local_48.it.super_MatConstIterator_<double>.super_MatConstIterator.sliceEnd =
       (pMVar4->it).super_MatConstIterator_<double>.super_MatConstIterator.sliceEnd;
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(&local_48,0.0);
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(pMVar4,(double)width_now * 0.5 + -0.5);
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(pMVar4,0.0);
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(pMVar4,dVar7);
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(pMVar4,(double)height_now * 0.5 + -0.5);
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(pMVar4,0.0);
  pMVar4 = cv::MatCommaInitializer_<double>::operator_(pMVar4,0.0);
  this = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar4,1.0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)local_4f0,this);
  cv::Mat::operator=((Mat *)Knew,(Mat *)local_4f0);
  cv::Mat::~Mat((Mat *)local_4f0);
  cv::Mat::~Mat((Mat *)&local_490);
  iVar2 = height_now;
  iVar1 = width_now;
  cv::Mat::Mat(local_a8,(Mat *)Kl);
  cv::Mat::Mat(local_108,(Mat *)Dl);
  cv::Mat::Mat(local_168,(Mat *)xil);
  cv::Mat::Mat(local_1c8,(Mat *)Rl);
  cv::Mat::Mat(local_228,(Mat *)Knew);
  local_4f8.width = iVar1;
  local_4f8.height = iVar2;
  InitUndistortRectifyMap
            (local_a8,local_108,local_168,local_1c8,local_228,&local_4f8,(Mat *)smap,
             (Mat *)(smap + 0x60));
  cv::Mat::~Mat(local_228);
  cv::Mat::~Mat(local_1c8);
  cv::Mat::~Mat(local_168);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat(local_a8);
  poVar5 = std::operator<<((ostream *)&std::cout,"Width: ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,width_now);
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,"Height: ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,height_now);
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,"V.Fov: ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,vfov_now);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"K Matrix: \n");
  cv::Formatter::get(&local_490,0);
  (**(code **)(*local_490 + 0x10))(local_4f0,local_490,Knew);
  (**(code **)(*(long *)local_4f0._0_8_ + 8))();
  while( true ) {
    pcVar6 = (char *)(*(code *)**(undefined8 **)local_4f0._0_8_)();
    if (pcVar6 == (char *)0x0) break;
    std::operator<<(poVar5,pcVar6);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4f0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_488);
  std::endl<char,std::char_traits<char>>(poVar5);
  bVar3 = std::operator==(&cam_model_abi_cxx11_,"stereo");
  if (bVar3) {
    cv::Mat::Mat(local_288,(Mat *)Kr);
    cv::Mat::Mat(local_2e8,(Mat *)Dr);
    cv::Mat::Mat(local_348,(Mat *)xir);
    cv::Mat::Mat(local_3a8,(Mat *)Rr);
    cv::Mat::Mat(local_408,(Mat *)Knew);
    local_500.width = iVar1;
    local_500.height = iVar2;
    InitUndistortRectifyMap
              (local_288,local_2e8,local_348,local_3a8,local_408,&local_500,(Mat *)(smap + 0xc0),
               (Mat *)(smap + 0x120));
    cv::Mat::~Mat(local_408);
    cv::Mat::~Mat(local_3a8);
    cv::Mat::~Mat(local_348);
    cv::Mat::~Mat(local_2e8);
    cv::Mat::~Mat(local_288);
    poVar5 = std::operator<<((ostream *)&std::cout,"Ndisp: ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,ndisp_now);
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::operator<<(poVar5,"Wsize: ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,wsize_now);
    std::operator<<(poVar5,"\n");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void InitRectifyMap() {
  double vfov_rad = vfov_now * CV_PI / 180.;
  double focal = height_now / 2. / tan(vfov_rad / 2.);
  Knew = (cv::Mat_<double>(3, 3) << focal, 0., width_now  / 2. - 0.5,
                                    0., focal, height_now / 2. - 0.5,
                                    0., 0., 1.);

  cv::Size img_size(width_now, height_now);

  InitUndistortRectifyMap(Kl, Dl, xil, Rl, Knew,
                          img_size, smap[0][0], smap[0][1]);

  std::cout << "Width: "  << width_now  << "\t"
            << "Height: " << height_now << "\t"
            << "V.Fov: "  << vfov_now   << "\n";
  std::cout << "K Matrix: \n" << Knew << std::endl;

  if (cam_model == "stereo") {
    InitUndistortRectifyMap(Kr, Dr, xir, Rr, Knew,
                            img_size, smap[1][0], smap[1][1]);
    std::cout << "Ndisp: " << ndisp_now << "\t"
              << "Wsize: " << wsize_now << "\n";
  }
  std::cout << std::endl;
}